

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

t_pvalue __thiscall
xemmai::t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
          (t_enum_of<std::filesystem::perms,_xemmai::t_os> *this,t_os *a_library,perms a_value)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  ulong local_10;
  
  local_10 = (ulong)a_value;
  ptVar1 = t_type_of<xemmai::t_object>::f_new<long,long>
                     ((a_library->v_type_permissions).v_p,(long *)&local_10);
  *(t_object **)
   &(this->
    super_t_derivable<xemmai::t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>,_xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>_>_>
    ).super_t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>.
    super_t_derives<std::filesystem::perms,_xemmai::t_type_of<long>_>.super_t_type_of<long>.
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_> = ptVar1;
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

static t_pvalue f_transfer(const T_library* a_library, T a_value)
	{
		return a_library->template f_type<typename t_fundamental<T>::t_type>()->template f_new<intptr_t>(static_cast<intptr_t>(a_value));
	}